

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O3

void __thiscall c4::yml::Tree::_claim_root(Tree *this)

{
  code *pcVar1;
  Location LVar2;
  bool bVar3;
  size_t ichild;
  char msg [23];
  char local_28 [24];
  
  ichild = _claim(this);
  if (ichild == 0) {
    _set_hierarchy(this,0,0xffffffffffffffff,0xffffffffffffffff);
    return;
  }
  builtin_strncpy(local_28,"check failed: (r == 0)",0x17);
  if (((byte)s_error_flags & 1) != 0) {
    bVar3 = is_debugger_attached();
    if (bVar3) {
      pcVar1 = (code *)swi(3);
      (*pcVar1)();
      return;
    }
  }
  LVar2.super_LineCol.col = 0;
  LVar2.super_LineCol.offset = SUB168(ZEXT816(0x6365) << 0x40,0);
  LVar2.super_LineCol.line = SUB168(ZEXT816(0x6365) << 0x40,8);
  LVar2.name.str =
       "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
  ;
  LVar2.name.len = 0x65;
  (*(this->m_callbacks).m_error)(local_28,0x17,LVar2,(this->m_callbacks).m_user_data);
  _set_hierarchy(this,ichild,0xffffffffffffffff,0xffffffffffffffff);
  return;
}

Assistant:

void Tree::_claim_root()
{
    size_t r = _claim();
    _RYML_CB_ASSERT(m_callbacks, r == 0);
    _set_hierarchy(r, NONE, NONE);
}